

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O3

void deMutex_selfTest(void)

{
  bool bVar1;
  deBool dVar2;
  deMutex dVar3;
  deThread dVar4;
  deThread *pdVar5;
  bool bVar6;
  int iVar7;
  deMutex mutex;
  deMutex local_60;
  undefined8 local_58;
  int local_50;
  deThread local_48 [2];
  deThread local_38;
  
  dVar3 = deMutex_create((deMutexAttributes *)0x0);
  if (dVar3 == 0) {
    deAssertFail("mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0xee);
  }
  deMutex_lock(dVar3);
  deMutex_unlock(dVar3);
  dVar2 = deMutex_tryLock(dVar3);
  if (dVar2 == 0) {
    deAssertFail("ret",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0xf5);
  }
  deMutex_unlock(dVar3);
  deMutex_destroy(dVar3);
  local_60 = CONCAT44(local_60._4_4_,1);
  dVar3 = deMutex_create((deMutexAttributes *)&local_60);
  if (dVar3 == 0) {
    deAssertFail("mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x107);
  }
  iVar7 = 10;
  do {
    deMutex_lock(dVar3);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  iVar7 = 10;
  do {
    deMutex_unlock(dVar3);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  deMutex_destroy(dVar3);
  dVar3 = deMutex_create((deMutexAttributes *)0x0);
  local_60 = dVar3;
  if (dVar3 == 0) {
    deAssertFail("mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x118);
  }
  deMutex_lock(dVar3);
  dVar4 = deThread_create(mutexTestThr1,&local_60,(deThreadAttributes *)0x0);
  if (dVar4 == 0) {
    deAssertFail("thread",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x11d);
  }
  deSleep(100);
  deMutex_unlock(local_60);
  deMutex_lock(local_60);
  deMutex_unlock(local_60);
  deThread_join(dVar4);
  deThread_destroy(dVar4);
  deMutex_destroy(local_60);
  dVar3 = deMutex_create((deMutexAttributes *)0x0);
  local_60 = dVar3;
  if (dVar3 == 0) {
    deAssertFail("data.mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x132);
  }
  local_58 = 0;
  local_50 = 1000;
  deMutex_lock(dVar3);
  pdVar5 = local_48;
  bVar1 = true;
  do {
    bVar6 = bVar1;
    dVar4 = deThread_create(mutexTestThr2,&local_60,(deThreadAttributes *)0x0);
    *pdVar5 = dVar4;
    if (dVar4 == 0) {
      deAssertFail("threads[ndx]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x13d);
    }
    pdVar5 = &local_38;
    bVar1 = false;
  } while (bVar6);
  deMutex_unlock(local_60);
  pdVar5 = local_48;
  bVar1 = true;
  do {
    bVar6 = bVar1;
    dVar4 = *pdVar5;
    dVar2 = deThread_join(dVar4);
    if (dVar2 == 0) {
      deAssertFail("ret",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x145);
    }
    deThread_destroy(dVar4);
    pdVar5 = &local_38;
    bVar1 = false;
  } while (bVar6);
  if ((int)local_58 != local_58._4_4_) {
    deAssertFail("data.counter == data.counter2",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x149);
  }
  if (local_50 != (int)local_58) {
    deAssertFail("data.maxVal == data.counter",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x14a);
  }
  deMutex_destroy(local_60);
  dVar3 = deMutex_create((deMutexAttributes *)0x0);
  local_60 = dVar3;
  if (dVar3 == 0) {
    deAssertFail("mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x154);
  }
  deMutex_lock(dVar3);
  dVar4 = deThread_create(mutexTestThr3,&local_60,(deThreadAttributes *)0x0);
  if (local_60 == 0) {
    deAssertFail("mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x159);
  }
  dVar2 = deThread_join(dVar4);
  if (dVar2 == 0) {
    deAssertFail("ret",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x15c);
  }
  deMutex_unlock(local_60);
  deMutex_destroy(local_60);
  deThread_destroy(dVar4);
  return;
}

Assistant:

void deMutex_selfTest (void)
{
	/* Default mutex from single thread. */
	{
		deMutex mutex = deMutex_create(DE_NULL);
		deBool	ret;
		DE_TEST_ASSERT(mutex);

		deMutex_lock(mutex);
		deMutex_unlock(mutex);

		/* Should succeed. */
		ret = deMutex_tryLock(mutex);
		DE_TEST_ASSERT(ret);
		deMutex_unlock(mutex);

		deMutex_destroy(mutex);
	}

	/* Recursive mutex. */
	{
		deMutexAttributes	attrs;
		deMutex				mutex;
		int					ndx;
		int					numLocks	= 10;

		deMemset(&attrs, 0, sizeof(attrs));

		attrs.flags = DE_MUTEX_RECURSIVE;

		mutex = deMutex_create(&attrs);
		DE_TEST_ASSERT(mutex);

		for (ndx = 0; ndx < numLocks; ndx++)
			deMutex_lock(mutex);

		for (ndx = 0; ndx < numLocks; ndx++)
			deMutex_unlock(mutex);

		deMutex_destroy(mutex);
	}

	/* Mutex and threads. */
	{
		deMutex		mutex;
		deThread	thread;

		mutex = deMutex_create(DE_NULL);
		DE_TEST_ASSERT(mutex);

		deMutex_lock(mutex);

		thread = deThread_create(mutexTestThr1, &mutex, DE_NULL);
		DE_TEST_ASSERT(thread);

		deSleep(100);
		deMutex_unlock(mutex);

		deMutex_lock(mutex);
		deMutex_unlock(mutex);

		deThread_join(thread);

		deThread_destroy(thread);
		deMutex_destroy(mutex);
	}

	/* A bit more complex mutex test. */
	{
		MutexData2	data;
		deThread	threads[2];
		int			ndx;

		data.mutex	= deMutex_create(DE_NULL);
		DE_TEST_ASSERT(data.mutex);

		data.counter	= 0;
		data.counter2	= 0;
		data.maxVal		= 1000;

		deMutex_lock(data.mutex);

		for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(threads); ndx++)
		{
			threads[ndx] = deThread_create(mutexTestThr2, &data, DE_NULL);
			DE_TEST_ASSERT(threads[ndx]);
		}

		deMutex_unlock(data.mutex);

		for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(threads); ndx++)
		{
			deBool ret = deThread_join(threads[ndx]);
			DE_TEST_ASSERT(ret);
			deThread_destroy(threads[ndx]);
		}

		DE_TEST_ASSERT(data.counter == data.counter2);
		DE_TEST_ASSERT(data.maxVal == data.counter);

		deMutex_destroy(data.mutex);
	}

	/* tryLock() deadlock test. */
	{
		deThread	thread;
		deMutex		mutex	= deMutex_create(DE_NULL);
		deBool		ret;
		DE_TEST_ASSERT(mutex);

		deMutex_lock(mutex);

		thread = deThread_create(mutexTestThr3, &mutex, DE_NULL);
		DE_TEST_ASSERT(mutex);

		ret = deThread_join(thread);
		DE_TEST_ASSERT(ret);

		deMutex_unlock(mutex);
		deMutex_destroy(mutex);
		deThread_destroy(thread);
	}
}